

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

ActionResultHolder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* testing::internal::ActionResultHolder<std::__cxx11::string>::PerformAction<std::__cxx11::string()>
            (Action<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
             *action,ArgumentTuple *args)

{
  ActionResultHolder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  ReferenceOrValueWrapper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  ArgumentTuple *local_18;
  ArgumentTuple *args_local;
  Action<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  *action_local;
  
  local_18 = args;
  args_local = (ArgumentTuple *)action;
  this = (ActionResultHolder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)operator_new(0x28);
  Action<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>::
  Perform(&local_58,
          (Action<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
           *)args_local);
  ReferenceOrValueWrapper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::ReferenceOrValueWrapper(&local_38,&local_58);
  ActionResultHolder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::ActionResultHolder(this,&local_38);
  ReferenceOrValueWrapper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~ReferenceOrValueWrapper(&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  return this;
}

Assistant:

static ActionResultHolder* PerformAction(
      const Action<F>& action, typename Function<F>::ArgumentTuple&& args) {
    return new ActionResultHolder(
        Wrapper(action.Perform(std::move(args))));
  }